

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# struct_packing_pass.cpp
# Opt level: O2

void __thiscall
spvtools::opt::StructPackingPass::StructPackingPass
          (StructPackingPass *this,char *structToPack,PackingRules rules)

{
  char *__s;
  allocator<char> local_19;
  
  Pass::Pass(&this->super_Pass);
  (this->super_Pass)._vptr_Pass = (_func_int **)&PTR__StructPackingPass_008a86f8;
  __s = "";
  if (structToPack != (char *)0x0) {
    __s = structToPack;
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)&this->structToPack_,__s,&local_19);
  this->packingRules_ = rules;
  (this->constantsMap_)._M_h._M_buckets = &(this->constantsMap_)._M_h._M_single_bucket;
  (this->constantsMap_)._M_h._M_bucket_count = 1;
  (this->constantsMap_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->constantsMap_)._M_h._M_element_count = 0;
  (this->constantsMap_)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->constantsMap_)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->constantsMap_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  return;
}

Assistant:

StructPackingPass::StructPackingPass(const char* structToPack,
                                     PackingRules rules)
    : structToPack_{structToPack != nullptr ? structToPack : ""},
      packingRules_{rules} {}